

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

char * google::protobuf::internal::WireFormat::_InternalParse
                 (Message *msg,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  int key;
  LogMessage *pLVar2;
  MessageOptions *this;
  Data *pDVar3;
  FieldDescriptor *pFStack_f0;
  int field_number;
  FieldDescriptor *field;
  undefined1 auStack_e0 [4];
  uint32_t tag;
  MessageSetParser message_set;
  LogMessage local_c0;
  LogFinisher local_85 [20];
  byte local_71;
  LogMessage local_70;
  Reflection *local_38;
  Reflection *reflection;
  Descriptor *descriptor;
  ParseContext *ctx_local;
  char *ptr_local;
  Message *msg_local;
  
  descriptor = (Descriptor *)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  reflection = (Reflection *)Message::GetDescriptor(msg);
  local_38 = Message::GetReflection((Message *)ptr_local);
  local_71 = 0;
  if (reflection == (Reflection *)0x0) {
    LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x30e);
    local_71 = 1;
    pLVar2 = LogMessage::operator<<(&local_70,"CHECK failed: descriptor: ");
    LogFinisher::operator=(local_85,pLVar2);
  }
  if ((local_71 & 1) != 0) {
    LogMessage::~LogMessage(&local_70);
  }
  message_set.reflection._7_1_ = 0;
  if (local_38 == (Reflection *)0x0) {
    LogMessage::LogMessage
              (&local_c0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x30f);
    message_set.reflection._7_1_ = 1;
    pLVar2 = LogMessage::operator<<(&local_c0,"CHECK failed: reflection: ");
    LogFinisher::operator=((LogFinisher *)((long)&message_set.reflection + 6),pLVar2);
  }
  if ((message_set.reflection._7_1_ & 1) != 0) {
    LogMessage::~LogMessage(&local_c0);
  }
  this = Descriptor::options((Descriptor *)reflection);
  bVar1 = MessageOptions::message_set_wire_format(this);
  if (bVar1) {
    _auStack_e0 = (Message *)ptr_local;
    message_set.msg = (Message *)reflection;
    message_set.descriptor = (Descriptor *)local_38;
    msg_local = (Message *)
                MessageSetParser::ParseMessageSet
                          ((MessageSetParser *)auStack_e0,(char *)ctx_local,
                           (ParseContext *)descriptor);
  }
  else {
    do {
      bVar1 = ParseContext::Done((ParseContext *)descriptor,(char **)&ctx_local);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return (char *)ctx_local;
      }
      ctx_local = (ParseContext *)ReadTag((char *)ctx_local,(uint32_t *)((long)&field + 4),0);
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
      if ((field._4_4_ == 0) || ((field._4_4_ & 7) == 4)) {
        EpsCopyInputStream::SetLastTag((EpsCopyInputStream *)descriptor,field._4_4_);
        return (char *)ctx_local;
      }
      key = WireFormatLite::GetTagFieldNumber(field._4_4_);
      pFStack_f0 = Descriptor::FindFieldByNumber((Descriptor *)reflection,key);
      if ((pFStack_f0 == (FieldDescriptor *)0x0) &&
         (bVar1 = Descriptor::IsExtensionNumber((Descriptor *)reflection,key), bVar1)) {
        pDVar3 = ParseContext::data((ParseContext *)descriptor);
        if (pDVar3->pool == (DescriptorPool *)0x0) {
          pFStack_f0 = Reflection::FindKnownExtensionByNumber(local_38,key);
        }
        else {
          pDVar3 = ParseContext::data((ParseContext *)descriptor);
          pFStack_f0 = DescriptorPool::FindExtensionByNumber
                                 (pDVar3->pool,(Descriptor *)reflection,key);
        }
      }
      ctx_local = (ParseContext *)
                  _InternalParseAndMergeField
                            ((Message *)ptr_local,(char *)ctx_local,(ParseContext *)descriptor,
                             (ulong)field._4_4_,local_38,pFStack_f0);
    } while (ctx_local != (ParseContext *)0x0);
    msg_local = (Message *)0x0;
  }
  return (char *)msg_local;
}

Assistant:

const char* WireFormat::_InternalParse(Message* msg, const char* ptr,
                                       internal::ParseContext* ctx) {
  const Descriptor* descriptor = msg->GetDescriptor();
  const Reflection* reflection = msg->GetReflection();
  GOOGLE_DCHECK(descriptor);
  GOOGLE_DCHECK(reflection);
  if (descriptor->options().message_set_wire_format()) {
    MessageSetParser message_set{msg, descriptor, reflection};
    return message_set.ParseMessageSet(ptr, ctx);
  }
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ReadTag(ptr, &tag);
    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
    if (tag == 0 || (tag & 7) == WireFormatLite::WIRETYPE_END_GROUP) {
      ctx->SetLastTag(tag);
      break;
    }
    const FieldDescriptor* field = nullptr;

    int field_number = WireFormatLite::GetTagFieldNumber(tag);
    field = descriptor->FindFieldByNumber(field_number);

    // If that failed, check if the field is an extension.
    if (field == nullptr && descriptor->IsExtensionNumber(field_number)) {
      if (ctx->data().pool == nullptr) {
        field = reflection->FindKnownExtensionByNumber(field_number);
      } else {
        field =
            ctx->data().pool->FindExtensionByNumber(descriptor, field_number);
      }
    }

    ptr = _InternalParseAndMergeField(msg, ptr, ctx, tag, reflection, field);
    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
  }
  return ptr;
}